

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

uchar charFromNibbles(char bigNibbleStr,char littleNibbleStr)

{
  char cVar1;
  byte bVar2;
  uchar littleNibbleVal;
  uchar bigNibbleVal;
  char littleNibbleStr_local;
  char bigNibbleStr_local;
  
  if ((bigNibbleStr < '0') || ('9' < bigNibbleStr)) {
    if (('`' < bigNibbleStr) && (bigNibbleStr < '{')) {
      bigNibbleStr = bigNibbleStr + -0x20;
    }
    cVar1 = bigNibbleStr + -0x37;
  }
  else {
    cVar1 = bigNibbleStr + -0x30;
  }
  if ((littleNibbleStr < '0') || ('9' < littleNibbleStr)) {
    if (('`' < littleNibbleStr) && (littleNibbleStr < '{')) {
      littleNibbleStr = littleNibbleStr + -0x20;
    }
    bVar2 = littleNibbleStr - 0x37;
  }
  else {
    bVar2 = littleNibbleStr - 0x30;
  }
  return cVar1 << 4 | bVar2;
}

Assistant:

static unsigned char charFromNibbles(char bigNibbleStr, char littleNibbleStr)
{
    unsigned char bigNibbleVal = NIBBLE_FROM_STRING(bigNibbleStr);
    unsigned char littleNibbleVal = NIBBLE_FROM_STRING(littleNibbleStr);

    return bigNibbleVal << 4 | littleNibbleVal;
}